

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::changeRowsBounds
          (Highs *this,HighsInt num_set_entries,HighsInt *set,double *lower,double *upper)

{
  bool bVar1;
  undefined1 uVar2;
  HighsInt HVar3;
  double *sorted_data2;
  HighsLogOptions *pHVar4;
  vector<int,_std::allocator<int>_> *in_RCX;
  int in_ESI;
  long in_RDI;
  double *in_R8;
  HighsStatus return_status;
  HighsStatus call_status;
  HighsInt create_error;
  HighsIndexCollection index_collection;
  vector<int,_std::allocator<int>_> local_set;
  vector<double,_std::allocator<double>_> local_upper;
  vector<double,_std::allocator<double>_> local_lower;
  bool null_data;
  Highs *in_stack_fffffffffffffc90;
  HighsLogOptions *this_00;
  HighsStatus in_stack_fffffffffffffca0;
  HighsStatus in_stack_fffffffffffffca4;
  undefined4 in_stack_fffffffffffffca8;
  HighsInt in_stack_fffffffffffffcac;
  HighsLogOptions *in_stack_fffffffffffffcb0;
  allocator *paVar5;
  string *in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  HighsInt dimension;
  string *in_stack_fffffffffffffcd0;
  HighsInt *set_00;
  HighsStatus highs_return_status;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  int iVar6;
  double *sorted_data0;
  double *data1;
  double *data0;
  undefined6 in_stack_fffffffffffffd50;
  byte bVar7;
  byte local_28a;
  allocator local_261;
  string local_260 [128];
  HighsStatus local_1e0;
  HighsStatus local_1dc;
  undefined4 local_1d8;
  allocator local_1d1;
  string local_1d0 [128];
  undefined4 in_stack_fffffffffffffeb0;
  double *in_stack_fffffffffffffeb8;
  HighsIndexCollection *in_stack_fffffffffffffec0;
  Highs *in_stack_fffffffffffffec8;
  double local_f1 [4];
  double local_d1 [8];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [39];
  byte local_31;
  double *local_30;
  vector<int,_std::allocator<int>_> *local_28;
  int local_14;
  HighsStatus local_4;
  
  if (in_ESI == 0) {
    local_4 = kOk;
  }
  else {
    local_31 = 0;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_14 = in_ESI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"row lower bounds",&local_59);
    bVar1 = doubleUserDataNotNull
                      (in_stack_fffffffffffffcb0,
                       (double *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                       (string *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    local_28a = 1;
    if (!bVar1) {
      local_28a = local_31;
    }
    local_31 = local_28a & 1;
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    sorted_data2 = (double *)(in_RDI + 0xe28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"row upper bounds",&local_91);
    uVar2 = doubleUserDataNotNull
                      (in_stack_fffffffffffffcb0,
                       (double *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                       (string *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    bVar7 = 1;
    if (!(bool)uVar2) {
      bVar7 = local_31;
    }
    local_31 = bVar7 & 1;
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    if ((local_31 & 1) == 0) {
      clearDerivedModelProperties(in_stack_fffffffffffffc90);
      HVar3 = (HighsInt)
              ((ulong)(&(local_28->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start + local_14) >> 0x20);
      std::allocator<double>::allocator((allocator<double> *)0x495012);
      std::vector<double,std::allocator<double>>::vector<double_const*,void>
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcd0,
                 (double *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                 (double *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 (allocator_type *)in_stack_fffffffffffffcb8);
      std::allocator<double>::~allocator((allocator<double> *)0x495046);
      data1 = local_30 + local_14;
      data0 = local_d1;
      std::allocator<double>::allocator((allocator<double> *)0x49507f);
      std::vector<double,std::allocator<double>>::vector<double_const*,void>
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcd0,
                 (double *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                 (double *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 (allocator_type *)in_stack_fffffffffffffcb8);
      std::allocator<double>::~allocator((allocator<double> *)0x4950b3);
      sorted_data0 = local_f1;
      std::allocator<int>::allocator((allocator<int> *)0x4950ec);
      std::vector<int,std::allocator<int>>::vector<int_const*,void>
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcd0,
                 (int *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                 (int *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 (allocator_type *)in_stack_fffffffffffffcb8);
      std::allocator<int>::~allocator((allocator<int> *)0x495120);
      iVar6 = local_14;
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x495152);
      pHVar4 = (HighsLogOptions *)
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x495164);
      this_00 = (HighsLogOptions *)0x0;
      sortSetData(HVar3,local_28,data0,data1,local_30,sorted_data0,
                  (double *)CONCAT17(uVar2,CONCAT16(bVar7,in_stack_fffffffffffffd50)),sorted_data2);
      set_00 = (HighsInt *)&stack0xfffffffffffffeb8;
      HighsIndexCollection::HighsIndexCollection((HighsIndexCollection *)this_00);
      std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x4951c6);
      HVar3 = create((HighsIndexCollection *)CONCAT44(iVar6,in_stack_fffffffffffffce8),local_14,
                     set_00,(HighsInt)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
      if (HVar3 == 0) {
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x4953fa);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x49540c);
        local_1dc = changeRowBoundsInterface
                              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                               in_stack_fffffffffffffeb8,
                               (double *)CONCAT44(HVar3,in_stack_fffffffffffffeb0));
        local_1e0 = 0;
        HighsLogOptions::HighsLogOptions(this_00,pHVar4);
        paVar5 = &local_261;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_260,"changeRowBounds",paVar5);
        in_stack_fffffffffffffca4 =
             interpretCallStatus((HighsLogOptions *)CONCAT44(local_14,in_stack_fffffffffffffce0),
                                 (HighsStatus)((ulong)set_00 >> 0x20),(HighsStatus)set_00,
                                 in_stack_fffffffffffffcd0);
        highs_return_status = (HighsStatus)((ulong)set_00 >> 0x20);
        local_1e0 = in_stack_fffffffffffffca4;
        std::__cxx11::string::~string(local_260);
        std::allocator<char>::~allocator((allocator<char> *)&local_261);
        HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4954fb);
        if (local_1e0 == kError) {
          local_4 = kError;
        }
        else {
          in_stack_fffffffffffffca0 =
               returnFromHighs((Highs *)CONCAT44(local_14,in_stack_fffffffffffffce0),
                               highs_return_status);
          local_4 = in_stack_fffffffffffffca0;
        }
      }
      else {
        HighsLogOptions::HighsLogOptions(this_00,pHVar4);
        paVar5 = &local_1d1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1d0,"changeRowsBounds",paVar5);
        dimension = (HighsInt)paVar5;
        std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x495272);
        local_4 = analyseSetCreateError
                            ((HighsLogOptions *)CONCAT44(HVar3,in_stack_fffffffffffffcc0),
                             in_stack_fffffffffffffcb8,
                             (HighsInt)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffffcb0 >> 0x18,0),
                             in_stack_fffffffffffffcac,
                             (HighsInt *)
                             CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),dimension
                            );
        std::__cxx11::string::~string(local_1d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
        HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4952e3);
      }
      local_1d8 = 1;
      HighsIndexCollection::~HighsIndexCollection((HighsIndexCollection *)this_00);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    }
    else {
      local_4 = kError;
    }
  }
  return local_4;
}

Assistant:

HighsStatus Highs::changeRowsBounds(const HighsInt num_set_entries,
                                    const HighsInt* set, const double* lower,
                                    const double* upper) {
  if (num_set_entries == 0) return HighsStatus::kOk;
  // Check for NULL data in "set" version of changeRowsBounds since
  // values are sorted with set
  bool null_data = false;
  null_data =
      doubleUserDataNotNull(options_.log_options, lower, "row lower bounds") ||
      null_data;
  null_data =
      doubleUserDataNotNull(options_.log_options, upper, "row upper bounds") ||
      null_data;
  if (null_data) return HighsStatus::kError;
  clearDerivedModelProperties();
  // Ensure that the set and data are in ascending order
  std::vector<double> local_lower{lower, lower + num_set_entries};
  std::vector<double> local_upper{upper, upper + num_set_entries};
  std::vector<HighsInt> local_set{set, set + num_set_entries};
  sortSetData(num_set_entries, local_set, lower, upper, NULL,
              local_lower.data(), local_upper.data(), NULL);
  HighsIndexCollection index_collection;
  const HighsInt create_error = create(index_collection, num_set_entries,
                                       local_set.data(), model_.lp_.num_row_);
  if (create_error)
    return analyseSetCreateError(options_.log_options, "changeRowsBounds",
                                 create_error, true, num_set_entries,
                                 local_set.data(), model_.lp_.num_row_);
  HighsStatus call_status = changeRowBoundsInterface(
      index_collection, local_lower.data(), local_upper.data());
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "changeRowBounds");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}